

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O1

DOMNode * __thiscall xercesc_4_0::DOMAttrMapImpl::setNamedItem(DOMAttrMapImpl *this,DOMNode *arg)

{
  DOMNodeVector *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  DOMDocument *doc;
  long *plVar4;
  long lVar5;
  DOMNodeImpl *this_01;
  DOMDocument *pDVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  DOMException *this_02;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  ulong index;
  DOMNode *pDVar7;
  DOMNode *pDVar8;
  MemoryManager **ppMVar9;
  undefined4 extraout_var;
  
  iVar2 = (*arg->_vptr_DOMNode[4])(arg);
  if (iVar2 == 2) {
    iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
    doc = (DOMDocument *)CONCAT44(extraout_var,iVar2);
    plVar4 = (long *)__dynamic_cast(arg,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                    0xfffffffffffffffe);
    if ((plVar4 == (long *)0x0) || (lVar5 = (**(code **)(*plVar4 + 0x10))(plVar4), lVar5 == 0)) {
      this_02 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
    }
    else {
      this_01 = (DOMNodeImpl *)(**(code **)(*plVar4 + 0x10))(plVar4);
      pDVar6 = DOMNodeImpl::getOwnerDocument(this_01);
      if (pDVar6 == doc) {
        bVar1 = readOnly(this);
        if (bVar1) {
          this_02 = (DOMException *)__cxa_allocate_exception(0x28);
          ppMVar9 = &XMLPlatformUtils::fgMemoryManager;
          if ((this->fOwnerNode != (DOMNode *)0x0) &&
             (iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(),
             CONCAT44(extraout_var_06,iVar2) != 0)) {
            iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
            ppMVar9 = (MemoryManager **)(CONCAT44(extraout_var_07,iVar2) + 0x158);
          }
          DOMException::DOMException(this_02,7,0,*ppMVar9);
        }
        else {
          iVar2 = (*arg->_vptr_DOMNode[4])(arg);
          if (((iVar2 == 2) && ((this_01->flags & 8) != 0)) &&
             (this_01->fOwnerNode != this->fOwnerNode)) {
            this_02 = (DOMException *)__cxa_allocate_exception(0x28);
            ppMVar9 = &XMLPlatformUtils::fgMemoryManager;
            if ((this->fOwnerNode != (DOMNode *)0x0) &&
               (iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(),
               CONCAT44(extraout_var_08,iVar2) != 0)) {
              iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
              ppMVar9 = (MemoryManager **)(CONCAT44(extraout_var_09,iVar2) + 0x158);
            }
            DOMException::DOMException(this_02,10,0,*ppMVar9);
          }
          else {
            this_01->fOwnerNode = this->fOwnerNode;
            this_01->flags = this_01->flags | 8;
            iVar2 = (*arg->_vptr_DOMNode[2])(arg);
            uVar3 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xe])
                              (this,CONCAT44(extraout_var_00,iVar2));
            if ((int)uVar3 < 0) {
              if (this->fNodes == (DOMNodeVector *)0x0) {
                pDVar7 = &doc[-1].super_DOMNode;
                if (doc == (DOMDocument *)0x0) {
                  pDVar7 = (DOMNode *)0x0;
                }
                iVar2 = (*pDVar7->_vptr_DOMNode[4])(pDVar7,0x18);
                DOMNodeVector::DOMNodeVector((DOMNodeVector *)CONCAT44(extraout_var_01,iVar2),doc);
                this->fNodes = (DOMNodeVector *)CONCAT44(extraout_var_01,iVar2);
              }
              DOMNodeVector::insertElementAt(this->fNodes,arg,(ulong)~uVar3);
              pDVar7 = (DOMNode *)0x0;
            }
            else {
              this_00 = this->fNodes;
              index = (ulong)uVar3;
              if (index < this_00->nextFreeSlot) {
                pDVar7 = this_00->data[index];
              }
              else {
                pDVar7 = (DOMNode *)0x0;
              }
              DOMNodeVector::setElementAt(this_00,arg,index);
            }
            if (pDVar7 == (DOMNode *)0x0) {
              return (DOMNode *)0x0;
            }
            pDVar8 = &doc->super_DOMNode;
            if (doc == (DOMDocument *)0x0) {
              pDVar8 = (DOMNode *)0x0;
            }
            plVar4 = (long *)__dynamic_cast(pDVar7,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                            0xfffffffffffffffe);
            if ((plVar4 == (long *)0x0) ||
               (lVar5 = (**(code **)(*plVar4 + 0x10))(plVar4), lVar5 == 0)) {
              this_02 = (DOMException *)__cxa_allocate_exception(0x28);
              DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
            }
            else {
              lVar5 = (**(code **)(*plVar4 + 0x10))(plVar4);
              *(DOMNode **)(lVar5 + 8) = pDVar8;
              plVar4 = (long *)__dynamic_cast(pDVar7,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                              0xfffffffffffffffe);
              if ((plVar4 != (long *)0x0) &&
                 (lVar5 = (**(code **)(*plVar4 + 0x10))(plVar4), lVar5 != 0)) {
                lVar5 = (**(code **)(*plVar4 + 0x10))(plVar4);
                *(ushort *)(lVar5 + 0x10) = *(ushort *)(lVar5 + 0x10) & 0xfff7;
                return pDVar7;
              }
              this_02 = (DOMException *)__cxa_allocate_exception(0x28);
              DOMException::DOMException(this_02,0xb,0,XMLPlatformUtils::fgMemoryManager);
            }
          }
        }
      }
      else {
        this_02 = (DOMException *)__cxa_allocate_exception(0x28);
        ppMVar9 = &XMLPlatformUtils::fgMemoryManager;
        if ((this->fOwnerNode != (DOMNode *)0x0) &&
           (iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_04,iVar2) != 0)
           ) {
          iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
          ppMVar9 = (MemoryManager **)(CONCAT44(extraout_var_05,iVar2) + 0x158);
        }
        DOMException::DOMException(this_02,4,0,*ppMVar9);
      }
    }
  }
  else {
    this_02 = (DOMException *)__cxa_allocate_exception(0x28);
    ppMVar9 = &XMLPlatformUtils::fgMemoryManager;
    if ((this->fOwnerNode != (DOMNode *)0x0) &&
       (iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])(), CONCAT44(extraout_var_02,iVar2) != 0)) {
      iVar2 = (*this->fOwnerNode->_vptr_DOMNode[0xc])();
      ppMVar9 = (MemoryManager **)(CONCAT44(extraout_var_03,iVar2) + 0x158);
    }
    DOMException::DOMException(this_02,3,0,*ppMVar9);
  }
  __cxa_throw(this_02,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMNode *DOMAttrMapImpl::setNamedItem(DOMNode *arg)
{
    if (arg->getNodeType() != DOMNode::ATTRIBUTE_NODE)
        throw DOMException(DOMException::HIERARCHY_REQUEST_ERR, 0, GetDOMNamedNodeMapMemoryManager);

    DOMDocument *doc = fOwnerNode->getOwnerDocument();
    DOMNodeImpl *argImpl = castToNodeImpl(arg);
    if(argImpl->getOwnerDocument() != doc)
        throw DOMException(DOMException::WRONG_DOCUMENT_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    if (this->readOnly())
        throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNamedNodeMapMemoryManager);
    if ((arg->getNodeType() == DOMNode::ATTRIBUTE_NODE) && argImpl->isOwned() && (argImpl->fOwnerNode != fOwnerNode))
        throw DOMException(DOMException::INUSE_ATTRIBUTE_ERR,0, GetDOMNamedNodeMapMemoryManager);

    argImpl->fOwnerNode = fOwnerNode;
    argImpl->isOwned(true);
    int i=findNamePoint(arg->getNodeName());
    DOMNode * previous=0;
    if(i>=0)
    {
        previous = fNodes->elementAt(i);
        fNodes->setElementAt(arg,i);
    }
    else
    {
        i=-1-i; // Insert point (may be end of list)
        if(0==fNodes)
        {
            fNodes=new ((DOMDocumentImpl*)doc) DOMNodeVector(doc);
        }
        fNodes->insertElementAt(arg,i);
    }
    if (previous != 0) {
        castToNodeImpl(previous)->fOwnerNode = doc;
        castToNodeImpl(previous)->isOwned(false);
    }

    return previous;
}